

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMatrix.cpp
# Opt level: O3

bool testMatrix(void)

{
  long *plVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  unsigned_long dd;
  void *__s;
  double *pdVar8;
  char *pcVar9;
  double *pdVar10;
  double *__s2;
  void *pvVar11;
  ulong uVar12;
  unsigned_long uVar13;
  bool bVar14;
  unsigned_long uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  char *pcVar19;
  unsigned_long aa;
  long lVar20;
  long lVar21;
  long lVar22;
  unsigned_long uVar23;
  unsigned_long uVar24;
  long lVar25;
  double result;
  double dVar26;
  DNN_NUMERIC DVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  TMatrix<double> local_f8;
  TMatrix<double> local_a8;
  double local_58;
  unsigned_long local_50;
  unsigned_long local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  
  uVar12 = 0;
  tfs::report_message("Info ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                      ,"localTestMatrix",0x13f,"Test Matrix - Start");
  __s = operator_new__(0xb40);
  memset(__s,0,0xb40);
LAB_0010efd4:
  if (uVar12 < 0xb40) goto code_r0x0010efdd;
  lVar16 = 0;
  lVar25 = 0;
  pvVar11 = __s;
  do {
    lVar17 = 0;
    bVar6 = true;
    do {
      bVar14 = bVar6;
      lVar17 = lVar17 + (long)pvVar11;
      lVar20 = 0;
      do {
        lVar21 = lVar25;
        lVar25 = lVar21 * 2 + 1;
        lVar18 = 0;
        do {
          plVar1 = (long *)(lVar17 + lVar18 * 4);
          *plVar1 = *plVar1 + lVar25;
          lVar18 = lVar18 + 2;
          lVar25 = lVar25 + 4;
        } while (lVar18 != 0x1e);
        lVar20 = lVar20 + 1;
        lVar17 = lVar17 + 0x78;
        lVar25 = lVar21 + 0x1e;
      } while (lVar20 != 4);
      lVar25 = lVar21 + 0x1e;
      lVar17 = 0x1e0;
      bVar6 = false;
    } while (bVar14);
    lVar16 = lVar16 + 1;
    pvVar11 = (void *)((long)pvVar11 + 0x3c0);
    lVar25 = lVar21 + 0x1e;
  } while (lVar16 != 3);
  lVar16 = 0;
  lVar25 = 0;
  pvVar11 = __s;
  do {
    lVar17 = 0;
    bVar6 = true;
    do {
      bVar14 = bVar6;
      lVar17 = lVar17 + (long)pvVar11;
      lVar20 = 0;
      do {
        lVar18 = lVar25;
        lVar25 = 0;
        do {
          *(long *)(lVar17 + lVar25 * 8) = lVar18 + lVar25;
          lVar25 = lVar25 + 1;
        } while (lVar25 != 0xf);
        lVar20 = lVar20 + 1;
        lVar17 = lVar17 + 0x78;
        lVar25 = lVar18 + 0xf;
      } while (lVar20 != 4);
      lVar25 = lVar18 + 0xf;
      lVar17 = 0x1e0;
      bVar6 = false;
    } while (bVar14);
    lVar16 = lVar16 + 1;
    pvVar11 = (void *)((long)pvVar11 + 0x3c0);
    lVar25 = lVar18 + 0xf;
  } while (lVar16 != 3);
  lVar16 = 0;
  pvVar11 = __s;
  lVar25 = 0;
  do {
    lVar20 = 0;
    lVar17 = lVar25;
    bVar6 = true;
    do {
      bVar14 = bVar6;
      lVar20 = lVar20 + (long)pvVar11;
      lVar21 = 0;
      lVar18 = lVar17;
      do {
        lVar22 = 0;
        do {
          lVar4 = *(long *)(lVar20 + lVar22 * 8);
          if (lVar18 + lVar22 != lVar4) {
            bVar6 = tfs::report_problem("Error",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                        ,"localTestMatrixSize",0x54,"value %lu != %lu",lVar4,
                                        lVar18 + lVar22);
            goto LAB_0010f18f;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 0xf);
        lVar21 = lVar21 + 1;
        lVar20 = lVar20 + 0x78;
        lVar18 = lVar18 + 0xf;
      } while (lVar21 != 4);
      lVar20 = 0x1e0;
      lVar17 = lVar17 + 0x3c;
      bVar6 = false;
    } while (bVar14);
    lVar16 = lVar16 + 1;
    pvVar11 = (void *)((long)pvVar11 + 0x3c0);
    lVar25 = lVar25 + 0x78;
  } while (lVar16 != 3);
  operator_delete__(__s);
  goto LAB_0010f1a2;
code_r0x0010efdd:
  plVar1 = (long *)((long)__s + uVar12);
  uVar12 = uVar12 + 8;
  if (*plVar1 != 0) goto LAB_0010efe8;
  goto LAB_0010efd4;
LAB_0010efe8:
  bVar6 = tfs::report_problem("Error",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                              ,"localTestMatrixSize",0x27,"Data element not zero");
LAB_0010f18f:
  operator_delete__(__s);
  if (bVar6 == false) {
    return false;
  }
LAB_0010f1a2:
  local_f8.m_a = 3;
  local_f8.m_b = 1;
  local_f8.m_c = 1;
  local_f8.m_d = 1;
  local_f8.m_ab = 3;
  local_f8.m_abc = 3;
  local_f8.m_count = 3;
  local_f8.m_length = 0x18;
  pdVar8 = (double *)operator_new__(0x18);
  local_f8.m_end = pdVar8 + 3;
  local_a8.m_a = 3;
  local_a8.m_b = 1;
  local_a8.m_c = 1;
  local_a8.m_d = 1;
  local_a8.m_ab = 3;
  local_a8.m_abc = 3;
  local_a8.m_count = 3;
  local_a8.m_length = 0x18;
  local_f8.m_data = pdVar8;
  local_a8.m_data = (double *)operator_new__(0x18);
  local_a8.m_end = local_a8.m_data + 3;
  *pdVar8 = 1.0;
  pdVar8[1] = 2.0;
  pdVar8[2] = 3.0;
  *local_a8.m_data = 4.0;
  local_a8.m_data[1] = -5.0;
  local_a8.m_data[2] = 6.0;
  dVar26 = 0.0;
  uVar12 = 0xfffffffffffffff8;
  do {
    dVar26 = dVar26 + *(double *)((long)pdVar8 + uVar12 + 8) *
                      *(double *)((long)local_a8.m_data + uVar12 + 8);
    uVar12 = uVar12 + 8;
  } while (uVar12 < 0x10);
  if ((dVar26 != 12.0) || (NAN(dVar26))) {
    pcVar19 = "dot product is not 12.0, it was %f";
    uVar13 = 0x6f;
LAB_0010f42b:
    bVar6 = tfs::report_problem("Error",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                ,"localTestMatrixMath",uVar13,pcVar19);
  }
  else {
    uVar12 = 0;
    dVar26 = 1.0;
    do {
      dVar30 = *(double *)((long)pdVar8 + uVar12 + 8);
      if (dVar26 <= dVar30) {
        dVar30 = dVar26;
      }
      uVar12 = uVar12 + 8;
      dVar26 = dVar30;
    } while (uVar12 < 0x10);
    if ((dVar30 != 1.0) || (NAN(dVar30))) {
      pcVar19 = "min is not 1.0, it was %f";
      uVar13 = 0x73;
      goto LAB_0010f42b;
    }
    uVar12 = 0;
    dVar26 = 1.0;
    do {
      dVar30 = *(double *)((long)pdVar8 + uVar12 + 8);
      if (dVar30 <= dVar26) {
        dVar30 = dVar26;
      }
      uVar12 = uVar12 + 8;
      dVar26 = dVar30;
    } while (uVar12 < 0x10);
    if ((dVar30 != 3.0) || (NAN(dVar30))) {
      pcVar19 = "max is not 3.0, it was %f";
      uVar13 = 0x77;
      goto LAB_0010f42b;
    }
    uVar12 = 0;
    dVar26 = 4.0;
    do {
      dVar30 = *(double *)((long)local_a8.m_data + uVar12 + 8);
      if (dVar26 <= dVar30) {
        dVar30 = dVar26;
      }
      uVar12 = uVar12 + 8;
      dVar26 = dVar30;
    } while (uVar12 < 0x10);
    if ((dVar30 != -5.0) || (NAN(dVar30))) {
      pcVar19 = "min is not -5.0, it was %f";
      uVar13 = 0x7f;
      goto LAB_0010f42b;
    }
    dVar26 = tfs::TMatrix<double>::max(&local_a8);
    if ((dVar26 != 6.0) || (NAN(dVar26))) {
      pcVar19 = "max is not 6.0, it was %f";
      uVar13 = 0x83;
      goto LAB_0010f42b;
    }
    dVar26 = tfs::TMatrix<double>::sum(&local_a8);
    if ((dVar26 != 5.0) || (NAN(dVar26))) {
      pcVar19 = "sum is not 5.0, it was %f";
      uVar13 = 0x87;
      goto LAB_0010f42b;
    }
    if ((local_a8.m_data != (double *)0x0) && (local_a8.m_length != 0)) {
      memset(local_a8.m_data,0,local_a8.m_length);
    }
    dVar26 = tfs::TMatrix<double>::min(&local_a8);
    if ((dVar26 != 0.0) || (NAN(dVar26))) {
      pcVar19 = "min is not 0.0, it was %f";
      uVar13 = 0x8c;
      goto LAB_0010f42b;
    }
    dVar26 = tfs::TMatrix<double>::max(&local_a8);
    if ((dVar26 != 0.0) || (NAN(dVar26))) {
      pcVar19 = "max is not 0.0, it was %f";
      uVar13 = 0x90;
      goto LAB_0010f42b;
    }
    tfs::TMatrix<double>::randomize(&local_f8);
    tfs::TMatrix<double>::randomize(&local_a8);
    dVar26 = tfs::TMatrix<double>::dot(&local_f8,&local_a8);
    bVar6 = true;
    if ((dVar26 == 12.0) && (!NAN(dVar26))) {
      tfs::report_problem("Warn ",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                          ,"localTestMatrixMath",0x96,
                          "dot product of two random matrices is 12.0, this is a surprise");
    }
  }
  if (local_a8.m_data != (double *)0x0) {
    operator_delete__(local_a8.m_data);
  }
  if (local_f8.m_data != (double *)0x0) {
    operator_delete__(local_f8.m_data);
  }
  if (bVar6 == false) {
    return false;
  }
  pcVar19 = (char *)operator_new__(0x18);
  pcVar9 = (char *)operator_new__(0x18);
  pcVar19[0] = '\0';
  pcVar19[1] = '\0';
  pcVar19[2] = '\0';
  pcVar19[3] = '\0';
  pcVar19[4] = '\0';
  pcVar19[5] = '\0';
  pcVar19[6] = '\0';
  pcVar19[7] = '\0';
  pcVar19[8] = '\0';
  pcVar19[9] = '\0';
  pcVar19[10] = '\0';
  pcVar19[0xb] = '\0';
  pcVar19[0xc] = '\0';
  pcVar19[0xd] = '\0';
  pcVar19[0xe] = -0x10;
  pcVar19[0xf] = '?';
  pcVar19[0x10] = '\0';
  pcVar19[0x11] = '\0';
  pcVar19[0x12] = '\0';
  pcVar19[0x13] = '\0';
  pcVar19[0x14] = '\0';
  pcVar19[0x15] = '\0';
  pcVar19[0x16] = '\0';
  pcVar19[0x17] = '@';
  pcVar9[0] = '\0';
  pcVar9[1] = '\0';
  pcVar9[2] = '\0';
  pcVar9[3] = '\0';
  pcVar9[4] = '\0';
  pcVar9[5] = '\0';
  pcVar9[6] = '\0';
  pcVar9[7] = '\0';
  pcVar9[8] = '\0';
  pcVar9[9] = '\0';
  pcVar9[10] = '\0';
  pcVar9[0xb] = '\0';
  pcVar9[0xc] = '\0';
  pcVar9[0xd] = '\0';
  pcVar9[0xe] = -0x10;
  pcVar9[0xf] = '?';
  pcVar9[0x10] = '\0';
  pcVar9[0x11] = '\0';
  pcVar9[0x12] = '\0';
  pcVar9[0x13] = '\0';
  pcVar9[0x14] = '\0';
  pcVar9[0x15] = '\0';
  pcVar9[0x16] = '\0';
  pcVar9[0x17] = '@';
  auVar31[0] = -(*pcVar9 == *pcVar19);
  auVar31[1] = -(pcVar9[1] == pcVar19[1]);
  auVar31[2] = -(pcVar9[2] == pcVar19[2]);
  auVar31[3] = -(pcVar9[3] == pcVar19[3]);
  auVar31[4] = -(pcVar9[4] == pcVar19[4]);
  auVar31[5] = -(pcVar9[5] == pcVar19[5]);
  auVar31[6] = -(pcVar9[6] == pcVar19[6]);
  auVar31[7] = -(pcVar9[7] == pcVar19[7]);
  auVar31[8] = -(pcVar9[8] == pcVar19[8]);
  auVar31[9] = -(pcVar9[9] == pcVar19[9]);
  auVar31[10] = -(pcVar9[10] == pcVar19[10]);
  auVar31[0xb] = -(pcVar9[0xb] == pcVar19[0xb]);
  auVar31[0xc] = -(pcVar9[0xc] == pcVar19[0xc]);
  auVar31[0xd] = -(pcVar9[0xd] == pcVar19[0xd]);
  auVar31[0xe] = -(pcVar9[0xe] == pcVar19[0xe]);
  auVar31[0xf] = -(pcVar9[0xf] == pcVar19[0xf]);
  uVar2 = *(undefined8 *)(pcVar19 + 0x10);
  auVar28[0] = -((char)uVar2 == '\0');
  auVar28[1] = -((char)((ulong)uVar2 >> 8) == '\0');
  auVar28[2] = -((char)((ulong)uVar2 >> 0x10) == '\0');
  auVar28[3] = -((char)((ulong)uVar2 >> 0x18) == '\0');
  auVar28[4] = -((char)((ulong)uVar2 >> 0x20) == '\0');
  auVar28[5] = -((char)((ulong)uVar2 >> 0x28) == '\0');
  auVar28[6] = -((char)((ulong)uVar2 >> 0x30) == '\0');
  auVar28[7] = -((char)((ulong)uVar2 >> 0x38) == '@');
  auVar28[8] = 0xff;
  auVar28[9] = 0xff;
  auVar28[10] = 0xff;
  auVar28[0xb] = 0xff;
  auVar28[0xc] = 0xff;
  auVar28[0xd] = 0xff;
  auVar28[0xe] = 0xff;
  auVar28[0xf] = 0xff;
  auVar28 = auVar28 & auVar31;
  uVar13 = 0xa6;
  if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff) {
    uVar12 = 0xfffffffffffffff8;
    do {
      *(double *)(pcVar19 + uVar12 + 8) = *(double *)(pcVar19 + uVar12 + 8) / 3.0;
      uVar12 = uVar12 + 8;
    } while (uVar12 < 0x10);
    pcVar9[8] = 'U';
    pcVar9[9] = 'U';
    pcVar9[10] = 'U';
    pcVar9[0xb] = 'U';
    pcVar9[0xc] = 'U';
    pcVar9[0xd] = 'U';
    pcVar9[0xe] = -0x2b;
    pcVar9[0xf] = '?';
    pcVar9[0x10] = 'U';
    pcVar9[0x11] = 'U';
    pcVar9[0x12] = 'U';
    pcVar9[0x13] = 'U';
    pcVar9[0x14] = 'U';
    pcVar9[0x15] = 'U';
    pcVar9[0x16] = -0x1b;
    pcVar9[0x17] = '?';
    auVar33[0] = -(*pcVar9 == *pcVar19);
    auVar33[1] = -(pcVar9[1] == pcVar19[1]);
    auVar33[2] = -(pcVar9[2] == pcVar19[2]);
    auVar33[3] = -(pcVar9[3] == pcVar19[3]);
    auVar33[4] = -(pcVar9[4] == pcVar19[4]);
    auVar33[5] = -(pcVar9[5] == pcVar19[5]);
    auVar33[6] = -(pcVar9[6] == pcVar19[6]);
    auVar33[7] = -(pcVar9[7] == pcVar19[7]);
    auVar33[8] = -(pcVar9[8] == pcVar19[8]);
    auVar33[9] = -(pcVar9[9] == pcVar19[9]);
    auVar33[10] = -(pcVar9[10] == pcVar19[10]);
    auVar33[0xb] = -(pcVar9[0xb] == pcVar19[0xb]);
    auVar33[0xc] = -(pcVar9[0xc] == pcVar19[0xc]);
    auVar33[0xd] = -(pcVar9[0xd] == pcVar19[0xd]);
    auVar33[0xe] = -(pcVar9[0xe] == pcVar19[0xe]);
    auVar33[0xf] = -(pcVar9[0xf] == pcVar19[0xf]);
    uVar2 = *(undefined8 *)(pcVar19 + 0x10);
    uVar3 = *(undefined8 *)(pcVar9 + 0x10);
    auVar35[0] = -((char)uVar3 == (char)uVar2);
    auVar35[1] = -((char)((ulong)uVar3 >> 8) == (char)((ulong)uVar2 >> 8));
    auVar35[2] = -((char)((ulong)uVar3 >> 0x10) == (char)((ulong)uVar2 >> 0x10));
    auVar35[3] = -((char)((ulong)uVar3 >> 0x18) == (char)((ulong)uVar2 >> 0x18));
    auVar35[4] = -((char)((ulong)uVar3 >> 0x20) == (char)((ulong)uVar2 >> 0x20));
    auVar35[5] = -((char)((ulong)uVar3 >> 0x28) == (char)((ulong)uVar2 >> 0x28));
    auVar35[6] = -((char)((ulong)uVar3 >> 0x30) == (char)((ulong)uVar2 >> 0x30));
    auVar35[7] = -((char)((ulong)uVar3 >> 0x38) == (char)((ulong)uVar2 >> 0x38));
    auVar35[8] = 0xff;
    auVar35[9] = 0xff;
    auVar35[10] = 0xff;
    auVar35[0xb] = 0xff;
    auVar35[0xc] = 0xff;
    auVar35[0xd] = 0xff;
    auVar35[0xe] = 0xff;
    auVar35[0xf] = 0xff;
    auVar35 = auVar35 & auVar33;
    uVar13 = 0xac;
    if ((ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) | (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar35[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0010f5ce;
    uVar12 = 0xfffffffffffffff8;
    do {
      *(double *)(pcVar19 + uVar12 + 8) = *(double *)(pcVar19 + uVar12 + 8) * 3.0;
      uVar12 = uVar12 + 8;
    } while (uVar12 < 0x10);
    uVar12 = 0xfffffffffffffff8;
    do {
      *(double *)(pcVar9 + uVar12 + 8) = *(double *)(pcVar9 + uVar12 + 8) / 0.3333333333333333;
      uVar12 = uVar12 + 8;
    } while (uVar12 < 0x10);
    auVar32[0] = -(*pcVar9 == *pcVar19);
    auVar32[1] = -(pcVar9[1] == pcVar19[1]);
    auVar32[2] = -(pcVar9[2] == pcVar19[2]);
    auVar32[3] = -(pcVar9[3] == pcVar19[3]);
    auVar32[4] = -(pcVar9[4] == pcVar19[4]);
    auVar32[5] = -(pcVar9[5] == pcVar19[5]);
    auVar32[6] = -(pcVar9[6] == pcVar19[6]);
    auVar32[7] = -(pcVar9[7] == pcVar19[7]);
    auVar32[8] = -(pcVar9[8] == pcVar19[8]);
    auVar32[9] = -(pcVar9[9] == pcVar19[9]);
    auVar32[10] = -(pcVar9[10] == pcVar19[10]);
    auVar32[0xb] = -(pcVar9[0xb] == pcVar19[0xb]);
    auVar32[0xc] = -(pcVar9[0xc] == pcVar19[0xc]);
    auVar32[0xd] = -(pcVar9[0xd] == pcVar19[0xd]);
    auVar32[0xe] = -(pcVar9[0xe] == pcVar19[0xe]);
    auVar32[0xf] = -(pcVar9[0xf] == pcVar19[0xf]);
    uVar2 = *(undefined8 *)(pcVar19 + 0x10);
    uVar3 = *(undefined8 *)(pcVar9 + 0x10);
    auVar34[0] = -((char)uVar3 == (char)uVar2);
    auVar34[1] = -((char)((ulong)uVar3 >> 8) == (char)((ulong)uVar2 >> 8));
    auVar34[2] = -((char)((ulong)uVar3 >> 0x10) == (char)((ulong)uVar2 >> 0x10));
    auVar34[3] = -((char)((ulong)uVar3 >> 0x18) == (char)((ulong)uVar2 >> 0x18));
    auVar34[4] = -((char)((ulong)uVar3 >> 0x20) == (char)((ulong)uVar2 >> 0x20));
    auVar34[5] = -((char)((ulong)uVar3 >> 0x28) == (char)((ulong)uVar2 >> 0x28));
    auVar34[6] = -((char)((ulong)uVar3 >> 0x30) == (char)((ulong)uVar2 >> 0x30));
    auVar34[7] = -((char)((ulong)uVar3 >> 0x38) == (char)((ulong)uVar2 >> 0x38));
    auVar34[8] = 0xff;
    auVar34[9] = 0xff;
    auVar34[10] = 0xff;
    auVar34[0xb] = 0xff;
    auVar34[0xc] = 0xff;
    auVar34[0xd] = 0xff;
    auVar34[0xe] = 0xff;
    auVar34[0xf] = 0xff;
    auVar34 = auVar34 & auVar32;
    uVar13 = 0xb1;
    if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0010f5ce;
    operator_delete__(pcVar9);
    operator_delete__(pcVar19);
  }
  else {
LAB_0010f5ce:
    bVar6 = tfs::report_problem("Error",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                ,"localTestMatrixMath2",uVar13,"aa && bb matrices are not the same."
                               );
    operator_delete__(pcVar9);
    operator_delete__(pcVar19);
    if (!bVar6) {
      return false;
    }
  }
  local_f8.m_a = 3;
  local_f8.m_b = 2;
  local_f8.m_c = 1;
  local_f8.m_d = 1;
  local_f8.m_ab = 6;
  local_f8.m_abc = 6;
  local_f8.m_count = 6;
  local_f8.m_length = 0x30;
  local_f8.m_data = (double *)operator_new__(0x30);
  local_f8.m_end = local_f8.m_data + 6;
  dVar26 = 0.0;
  uVar12 = 0xfffffffffffffff8;
  do {
    dVar26 = dVar26 + 1.0;
    *(double *)((long)local_f8.m_data + uVar12 + 8) = dVar26;
    uVar12 = uVar12 + 8;
  } while (uVar12 < 0x28);
  tfs::TMatrix<double>::TMatrix(&local_a8,&local_f8,true);
  pdVar8 = local_a8.m_data;
  pcVar19 = "aa && bb matrices are not the same.";
  uVar13 = 0xc4;
  if ((((((local_f8.m_data == (double *)0x0) || (local_a8.m_data == (double *)0x0)) ||
        (local_f8.m_length == 0)) ||
       ((local_f8.m_length != local_a8.m_length || (local_f8.m_a != local_a8.m_a)))) ||
      (local_f8.m_b != local_a8.m_b)) ||
     (((local_f8.m_c != local_a8.m_c || (local_f8.m_d != local_a8.m_d)) ||
      (iVar7 = bcmp(local_f8.m_data,local_a8.m_data,local_f8.m_length), pdVar10 = local_a8.m_end,
      iVar7 != 0)))) {
LAB_0010f710:
    bVar6 = tfs::report_problem("Error",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                ,"localTestMatrixCopy",uVar13,pcVar19);
  }
  else {
    if (local_a8.m_count == 0 || local_a8.m_end <= pdVar8) {
      tfs::report_problem("Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                          ,"randomize",0x5e,"empty matrix");
    }
    else {
      auVar29._8_4_ = (int)(local_a8.m_count >> 0x20);
      auVar29._0_8_ = local_a8.m_count;
      auVar29._12_4_ = 0x45300000;
      dVar30 = (auVar29._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_a8.m_count) - 4503599627370496.0);
      dVar26 = 1.0;
      if (1.0 <= dVar30) {
        dVar26 = dVar30;
      }
      local_58 = SQRT(1.0 / dVar26);
      do {
        DVar27 = tfs::randomGauss();
        *pdVar8 = DVar27 * local_58;
        pdVar8 = pdVar8 + 1;
      } while (pdVar8 < pdVar10);
    }
    pdVar8 = local_f8.m_data;
    if (((((local_f8.m_data != (double *)0x0) && (local_a8.m_data != (double *)0x0)) &&
         (local_f8.m_length != 0)) &&
        ((local_f8.m_length == local_a8.m_length && (local_f8.m_a == local_a8.m_a)))) &&
       (((local_f8.m_b == local_a8.m_b &&
         ((local_f8.m_c == local_a8.m_c && (local_f8.m_d == local_a8.m_d)))) &&
        (iVar7 = bcmp(local_f8.m_data,local_a8.m_data,local_f8.m_length), iVar7 == 0)))) {
      pcVar19 = "aa && bb matrices are the same.";
      uVar13 = 0xc9;
      goto LAB_0010f710;
    }
    pdVar10 = (double *)operator_new__(0x30);
    bVar6 = local_f8.m_length != 0x30;
    if (bVar6 || pdVar8 == (double *)0x0) {
LAB_00110194:
      __s2 = (double *)operator_new__(0x30);
      if (!bVar6 && pdVar8 != (double *)0x0) {
        dVar26 = *pdVar8;
        dVar30 = pdVar8[1];
        auVar28 = *(undefined1 (*) [16])(pdVar8 + 2);
        dVar5 = pdVar8[5];
        __s2[4] = pdVar8[4];
        __s2[5] = dVar5;
        *(undefined1 (*) [16])(__s2 + 2) = auVar28;
        *__s2 = dVar26;
        __s2[1] = dVar30;
      }
      iVar7 = bcmp(pdVar10,__s2,0x30);
      if (iVar7 == 0) {
        bVar6 = true;
      }
      else {
        bVar6 = tfs::report_problem("Error",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                    ,"localTestMatrixCopy",0xd4,
                                    "cc && dd matrices are not the same.");
      }
      operator_delete__(__s2);
    }
    else {
      dVar26 = *pdVar8;
      dVar30 = pdVar8[1];
      auVar28 = *(undefined1 (*) [16])(pdVar8 + 2);
      dVar5 = pdVar8[5];
      pdVar10[4] = pdVar8[4];
      pdVar10[5] = dVar5;
      *(undefined1 (*) [16])(pdVar10 + 2) = auVar28;
      *pdVar10 = dVar26;
      pdVar10[1] = dVar30;
      if ((((local_f8.m_a != 1) || (local_f8.m_b != 2)) || (local_f8.m_c != 3)) ||
         ((local_f8.m_d != 1 || (iVar7 = bcmp(pdVar8,pdVar10,0x30), iVar7 != 0))))
      goto LAB_00110194;
      bVar6 = tfs::report_problem("Error",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                  ,"localTestMatrixCopy",0xcf,"aa && cc matrices are the same.");
    }
    operator_delete__(pdVar10);
  }
  if (local_a8.m_data != (double *)0x0) {
    operator_delete__(local_a8.m_data);
  }
  if (local_f8.m_data != (double *)0x0) {
    operator_delete__(local_f8.m_data);
  }
  if (bVar6 == false) {
    return false;
  }
  local_f8.m_a = 10;
  local_f8.m_b = 10;
  local_f8.m_c = 3;
  local_f8.m_d = 2;
  local_f8.m_ab = 100;
  local_f8.m_abc = 300;
  local_f8.m_count = 600;
  local_f8.m_length = 0x12c0;
  pdVar8 = (double *)operator_new__(0x12c0);
  local_f8.m_end = pdVar8 + 600;
  local_a8.m_a = 10;
  local_a8.m_b = 10;
  local_a8.m_c = 3;
  local_a8.m_d = 2;
  local_a8.m_ab = 100;
  local_a8.m_abc = 300;
  local_a8.m_count = 600;
  local_a8.m_length = 0x12c0;
  local_f8.m_data = pdVar8;
  pdVar10 = (double *)operator_new__(0x12c0);
  local_a8.m_end = pdVar10 + 600;
  local_a8.m_data = pdVar10;
  tfs::fill(&local_f8);
  tfs::fill(&local_a8);
  iVar7 = bcmp(pdVar8,pdVar10,0x12c0);
  if (iVar7 == 0) {
    pdVar10[0x1c7] = 3.1415926;
    iVar7 = bcmp(pdVar8,pdVar10,0x12c0);
    if (iVar7 == 0) {
      pcVar19 = "matrices are different, but reporting as equal";
      uVar13 = 0xf9;
      goto LAB_0010f853;
    }
    operator_delete__(pdVar10);
    operator_delete__(pdVar8);
  }
  else {
    pcVar19 = "matrices are equal, but reporting as different";
    uVar13 = 0xf5;
LAB_0010f853:
    bVar6 = tfs::report_problem("Error",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                ,"localTestMatrixEqual",uVar13,pcVar19);
    operator_delete__(pdVar10);
    operator_delete__(pdVar8);
    if (!bVar6) {
      return false;
    }
  }
  local_f8.m_a = 4;
  local_f8.m_b = 4;
  local_f8.m_c = 3;
  local_f8.m_d = 1;
  local_f8.m_ab = 0x10;
  local_f8.m_abc = 0x30;
  local_f8.m_count = 0x30;
  local_f8.m_length = 0x180;
  local_f8.m_data = (double *)operator_new__(0x180);
  local_f8.m_end = local_f8.m_data + 0x30;
  local_a8.m_a = 2;
  local_a8.m_b = 2;
  local_a8.m_c = 3;
  local_a8.m_d = 1;
  local_a8.m_ab = 4;
  local_a8.m_abc = 0xc;
  local_a8.m_count = 0xc;
  local_a8.m_length = 0x60;
  local_a8.m_data = (double *)operator_new__(0x60);
  local_a8.m_end = local_a8.m_data + 0xc;
  tfs::fill(&local_f8);
  if ((local_a8.m_data != (double *)0x0) && (local_a8.m_length != 0)) {
    memset(local_a8.m_data,0,local_a8.m_length);
  }
  bVar6 = tfs::subsample(&local_a8,&local_f8,1,1);
  if (bVar6) {
    local_38 = local_a8.m_a;
    local_48 = local_a8.m_c;
    uVar13 = local_a8.m_b;
    if (local_a8.m_c != 0) {
      uVar15 = 0;
      local_50 = local_a8.m_b;
      do {
        if (uVar13 != 0) {
          lVar25 = 1;
          uVar24 = 0;
          do {
            local_40 = uVar24 + 1;
            uVar13 = 0;
            while (uVar23 = uVar13, local_38 != uVar23) {
              lVar16 = lVar25 * local_f8.m_a + local_f8.m_ab * uVar15;
              uVar12 = lVar16 + 1 + uVar23;
              if (local_f8.m_count <= uVar12) {
                tfs::report_problem("Error",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                                    ,"getIndex",0x96,
                                    "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu"
                                    ,uVar12,local_f8.m_count,uVar23 + 1,local_f8.m_a,local_40,
                                    local_f8.m_b,uVar15,local_f8.m_c);
              }
              local_58 = local_f8.m_data[lVar16 + uVar23 + 1];
              uVar12 = uVar24 * local_a8.m_a + local_a8.m_ab * uVar15 + uVar23;
              if (local_a8.m_count <= uVar12) {
                tfs::report_problem("Error",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                                    ,"getIndex",0x96,
                                    "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu"
                                    ,uVar12,local_a8.m_count,uVar23,local_a8.m_a,uVar24,local_a8.m_b
                                    ,uVar15,local_a8.m_c);
              }
              if ((local_58 != local_a8.m_data[uVar12]) ||
                 (uVar13 = uVar23 + 1, NAN(local_58) || NAN(local_a8.m_data[uVar12]))) {
                bVar6 = tfs::report_problem("Error",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                            ,"localTestMatrixSubsample",0x114,
                                            "Values do not match: %f/%f, %lu, %lu, %lu",uVar23,
                                            uVar24,uVar15);
                goto LAB_0010ff1b;
              }
            }
            lVar25 = lVar25 + 1;
            uVar13 = local_50;
            uVar24 = local_40;
          } while (local_40 != local_50);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != local_48);
    }
    bVar6 = tfs::subsample(&local_a8,&local_f8,1,2);
    if (bVar6) {
      if (local_48 != 0) {
        uVar15 = 0;
        local_50 = uVar13;
        do {
          if (uVar13 != 0) {
            lVar25 = 2;
            uVar24 = 0;
            do {
              local_40 = uVar24 + 2;
              uVar13 = 0;
              while (uVar23 = uVar13, local_38 != uVar23) {
                lVar16 = lVar25 * local_f8.m_a + local_f8.m_ab * uVar15;
                uVar12 = lVar16 + 1 + uVar23;
                if (local_f8.m_count <= uVar12) {
                  tfs::report_problem("Error",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                                      ,"getIndex",0x96,
                                      "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu"
                                      ,uVar12,local_f8.m_count,uVar23 + 1,local_f8.m_a,local_40,
                                      local_f8.m_b,uVar15,local_f8.m_c);
                }
                local_58 = local_f8.m_data[lVar16 + uVar23 + 1];
                uVar12 = uVar24 * local_a8.m_a + local_a8.m_ab * uVar15 + uVar23;
                if (local_a8.m_count <= uVar12) {
                  tfs::report_problem("Error",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                                      ,"getIndex",0x96,
                                      "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu"
                                      ,uVar12,local_a8.m_count,uVar23,local_a8.m_a,uVar24,
                                      local_a8.m_b,uVar15,local_a8.m_c);
                }
                if ((local_58 != local_a8.m_data[uVar12]) ||
                   (uVar13 = uVar23 + 1, NAN(local_58) || NAN(local_a8.m_data[uVar12]))) {
                  bVar6 = tfs::report_problem("Error",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                              ,"localTestMatrixSubsample",0x124,
                                              "Values do not match: %f/%f, %lu, %lu, %lu",uVar23,
                                              uVar24,uVar15);
                  goto LAB_0010ff1b;
                }
              }
              uVar24 = uVar24 + 1;
              lVar25 = lVar25 + 1;
              uVar13 = local_50;
            } while (uVar24 != local_50);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != local_48);
      }
      bVar6 = tfs::subsample(&local_a8,&local_f8,0,0);
      if (bVar6 && local_48 != 0) {
        uVar15 = 0;
        local_50 = uVar13;
        do {
          if (uVar13 != 0) {
            uVar24 = 0;
            do {
              if (local_38 != 0) {
                uVar13 = 0;
                do {
                  uVar12 = uVar24 * local_f8.m_a + local_f8.m_ab * uVar15 + uVar13;
                  if (local_f8.m_count <= uVar12) {
                    tfs::report_problem("Error",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                                        ,"getIndex",0x96,
                                        "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu"
                                        ,uVar12,local_f8.m_count,uVar13,local_f8.m_a,uVar24,
                                        local_f8.m_b,uVar15,local_f8.m_c);
                  }
                  local_58 = local_f8.m_data[uVar12];
                  uVar12 = uVar24 * local_a8.m_a + local_a8.m_ab * uVar15 + uVar13;
                  if (local_a8.m_count <= uVar12) {
                    tfs::report_problem("Error",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                                        ,"getIndex",0x96,
                                        "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu"
                                        ,uVar12,local_a8.m_count,uVar13,local_a8.m_a,uVar24,
                                        local_a8.m_b,uVar15,local_a8.m_c);
                  }
                  if ((local_58 != local_a8.m_data[uVar12]) ||
                     (NAN(local_58) || NAN(local_a8.m_data[uVar12]))) {
                    bVar6 = tfs::report_problem("Error",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                                ,"localTestMatrixSubsample",0x134,
                                                "Values do not match: %f/%f, %lu, %lu, %lu",uVar13,
                                                uVar24,uVar15);
                    goto LAB_0010ff1b;
                  }
                  uVar13 = uVar13 + 1;
                } while (local_38 != uVar13);
              }
              uVar24 = uVar24 + 1;
              uVar13 = local_50;
            } while (uVar24 != local_50);
          }
          uVar15 = uVar15 + 1;
          bVar6 = true;
        } while (uVar15 != local_48);
      }
      goto LAB_0010ff1b;
    }
  }
  bVar6 = false;
LAB_0010ff1b:
  if (local_a8.m_data != (double *)0x0) {
    operator_delete__(local_a8.m_data);
  }
  if (local_f8.m_data != (double *)0x0) {
    operator_delete__(local_f8.m_data);
  }
  if (bVar6 == false) {
    return false;
  }
  tfs::report_message("Info ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                      ,"localTestMatrix",0x152,"Test Matrix - End");
  return true;
}

Assistant:

static bool
    localTestMatrix( void ) {
        log_info( "Test Matrix - Start" );
        if( !localTestMatrixSize()) {
            return false;
        }
        if( !localTestMatrixMath()) {
            return false;
        }
        if( !localTestMatrixMath2()) {
            return false;
        }
        if( !localTestMatrixCopy()) {
            return false;
        }
        if( !localTestMatrixEqual()) {
            return false;
        }
        if( !localTestMatrixSubsample()) {
            return false;
        }
        log_info( "Test Matrix - End" );
        return true;
    }